

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  void *pvVar6;
  TEvalOpts *this;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  undefined4 uVar11;
  undefined4 uVar20;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double *in_stack_00000158;
  size_t in_stack_00000160;
  double *in_stack_00000168;
  double *in_stack_00000178;
  size_t in_stack_00000180;
  double *in_stack_00000188;
  float *in_stack_00000238;
  size_t in_stack_00000240;
  float *in_stack_00000248;
  float *in_stack_00000258;
  size_t in_stack_00000260;
  float *in_stack_00000268;
  double *in_stack_000002d8;
  size_t in_stack_000002e0;
  double *in_stack_000002e8;
  double *in_stack_000002f8;
  size_t in_stack_00000300;
  double *in_stack_00000308;
  double approxVal_7;
  double trueVal_7;
  double input_7;
  float approxVal_6;
  float trueVal_6;
  float input_6;
  double error_3;
  size_t i_3;
  double approxVal_5;
  double trueVal_5;
  double input_5;
  float approxVal_4;
  float trueVal_4;
  float input_4;
  double error_2;
  size_t i_2;
  double approxVal_3;
  double trueVal_3;
  double input_3;
  float approxVal_2;
  float trueVal_2;
  float input_2;
  double error_1;
  size_t i_1;
  double approxVal_1;
  double trueVal_1;
  double input_1;
  float approxVal;
  float trueVal;
  float input;
  double error;
  size_t i;
  double maxError;
  size_t n;
  float hi;
  float lo;
  bool isAvx;
  bool isAvx2;
  TEvalOpts opts;
  char **in_stack_00000aa0;
  int in_stack_00000aac;
  double *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  double *in_stack_fffffffffffffb68;
  double *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  double *in_stack_fffffffffffffbc8;
  float local_3e0;
  float local_384;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  size_t in_stack_fffffffffffffce0;
  double *in_stack_fffffffffffffce8;
  float local_2cc;
  float *in_stack_fffffffffffffd58;
  size_t in_stack_fffffffffffffd60;
  float *in_stack_fffffffffffffd68;
  float local_270;
  float *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  ostream *in_stack_fffffffffffffda8;
  float local_214;
  double *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  float local_1b8;
  undefined5 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  double in_stack_fffffffffffffe80;
  float *in_stack_fffffffffffffe88;
  float local_164;
  double local_158;
  ulong local_150;
  double local_148;
  float local_12c;
  double local_120;
  ulong local_118;
  double local_110;
  float local_f4;
  double local_e8;
  ulong local_e0;
  double local_d8;
  float local_bc;
  double local_b0;
  ulong local_a8;
  double local_a0;
  float local_48;
  float local_44;
  long local_40;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  
  ParseOptions(in_stack_00000aac,in_stack_00000aa0);
  if ((local_17 & 1) != 0) {
    MXCSR = MXCSR & 0xffff7fbf | 0x8040;
  }
  uVar1 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
  if (((!(bool)uVar1) &&
      (in_stack_fffffffffffffe7e =
            std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58),
      !(bool)in_stack_fffffffffffffe7e)) &&
     (in_stack_fffffffffffffe7d =
           std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58),
     !(bool)in_stack_fffffffffffffe7d)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "requirement arch == \"plain\" || arch == \"avx2\" || arch == \"avx\" failed"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  bVar2 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
  if (((!bVar2) &&
      (bVar2 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58), !bVar2)
      ) && ((bVar2 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58),
            !bVar2 && (bVar2 = std::operator==(in_stack_fffffffffffffb60,
                                               (char *)in_stack_fffffffffffffb58), !bVar2)))) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "requirement func == \"exp\" || func == \"log\" || func == \"sigm\" || func == \"tanh\" failed"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  bVar2 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
  bVar3 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
  if ((local_15 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"input\ttrue\tapprox");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  local_a0 = 0.0;
  bVar4 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
  uVar11 = (undefined4)local_40;
  uVar20 = (undefined4)((ulong)local_40 >> 0x20);
  if (bVar4) {
    for (local_a8 = 0; local_a8 < local_40 + 1U; local_a8 = local_a8 + 1) {
      if ((local_16 & 1) == 0) {
        local_1b8 = (float)local_a8;
        auVar12._8_4_ = uVar20;
        auVar12._0_8_ = local_40;
        auVar12._12_4_ = 0x45300000;
        fVar8 = (float)((double)local_48 +
                       (double)((local_44 - local_48) * local_1b8) /
                       ((auVar12._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0)));
        dVar9 = std::exp((double)(ulong)(uint)fVar8);
        if ((local_18 & 1) == 0) {
          if (bVar2) {
            NFastOps::ExpAvx2<false,false>(in_stack_00000268,in_stack_00000260,in_stack_00000258);
          }
          else if (bVar3) {
            NFastOps::ExpAvx<false,false>(in_stack_00000248,in_stack_00000240,in_stack_00000238);
          }
          else {
            NFastOps::ExpPlain((float *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                               (float *)in_stack_fffffffffffffb60);
          }
        }
        else if (bVar2) {
          NFastOps::ExpAvx2<true,false>
                    ((float *)in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd98);
        }
        else if (bVar3) {
          NFastOps::ExpAvx<true,false>
                    (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        }
        else {
          NFastOps::ExpPlain((float *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                             (float *)in_stack_fffffffffffffb60);
        }
        local_b0 = GetRelError((double)SUB84(dVar9,0),(double)local_bc);
        if ((local_15 & 1) != 0) {
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,fVar8);
          poVar5 = std::operator<<(poVar5,"\t");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,SUB84(dVar9,0));
          poVar5 = std::operator<<(poVar5,"\t");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_bc);
          poVar5 = std::operator<<(poVar5,"\t");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,local_b0);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        local_214 = (float)local_a8;
        auVar13._8_4_ = uVar20;
        auVar13._0_8_ = local_40;
        auVar13._12_4_ = 0x45300000;
        dVar9 = (double)local_48 +
                (double)((local_44 - local_48) * local_214) /
                ((auVar13._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0));
        dVar10 = exp(dVar9);
        if ((local_18 & 1) == 0) {
          if (bVar2) {
            NFastOps::ExpAvx2<false,false>(in_stack_00000188,in_stack_00000180,in_stack_00000178);
          }
          else if (bVar3) {
            NFastOps::ExpAvx<false,false>(in_stack_00000168,in_stack_00000160,in_stack_00000158);
          }
          else {
            NFastOps::ExpPlain(in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                               (double *)in_stack_fffffffffffffb60);
          }
        }
        else if (bVar2) {
          NFastOps::ExpAvx2<true,false>
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (double *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        }
        else if (bVar3) {
          NFastOps::ExpAvx<true,false>
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (double *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        }
        else {
          NFastOps::ExpPlain(in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                             (double *)in_stack_fffffffffffffb60);
        }
        local_b0 = GetRelError(dVar10,local_d8);
        if ((local_15 & 1) != 0) {
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,dVar9);
          poVar5 = std::operator<<(poVar5,"\t");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar10);
          poVar5 = std::operator<<(poVar5,"\t");
          in_stack_fffffffffffffda8 = (ostream *)std::ostream::operator<<(poVar5,local_d8);
          in_stack_fffffffffffffda0 = std::operator<<(in_stack_fffffffffffffda8,"\t");
          in_stack_fffffffffffffd98 =
               (float *)std::ostream::operator<<(in_stack_fffffffffffffda0,local_b0);
          std::ostream::operator<<(in_stack_fffffffffffffd98,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      if (local_a0 < local_b0) {
        local_a0 = local_b0;
      }
    }
  }
  else {
    bVar4 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
    if (bVar4) {
      for (local_e0 = 0; local_e0 < local_40 + 1U; local_e0 = local_e0 + 1) {
        if ((local_16 & 1) == 0) {
          local_270 = (float)local_e0;
          auVar14._8_4_ = uVar20;
          auVar14._0_8_ = local_40;
          auVar14._12_4_ = 0x45300000;
          dVar9 = std::exp((double)(ulong)(uint)(float)((double)local_48 +
                                                       (double)((local_44 - local_48) * local_270) /
                                                       ((auVar14._8_8_ - 1.9342813113834067e+25) +
                                                       ((double)CONCAT44(0x43300000,uVar11) -
                                                       4503599627370496.0))));
          dVar10 = std::log((double)((ulong)dVar9 & 0xffffffff));
          if ((local_18 & 1) == 0) {
            if (bVar2) {
              NFastOps::LogAvx2<false,false>
                        ((float *)input_3,(size_t)trueVal_3,(float *)approxVal_3);
            }
            else if (bVar3) {
              NFastOps::LogAvx<false,false>((float *)trueVal_5,(size_t)approxVal_5,(float *)i_3);
            }
            else {
              NFastOps::LogPlain((float *)in_stack_fffffffffffffb70,
                                 (size_t)in_stack_fffffffffffffb68,
                                 (float *)in_stack_fffffffffffffb60);
            }
          }
          else if (bVar2) {
            NFastOps::LogAvx2<true,false>
                      (in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                       (float *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe7e,
                                                        CONCAT15(in_stack_fffffffffffffe7d,
                                                                 in_stack_fffffffffffffe78))));
          }
          else if (bVar3) {
            NFastOps::LogAvx<true,false>
                      (in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                       (float *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe7e,
                                                        CONCAT15(in_stack_fffffffffffffe7d,
                                                                 in_stack_fffffffffffffe78))));
          }
          else {
            NFastOps::LogPlain((float *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                               (float *)in_stack_fffffffffffffb60);
          }
          local_e8 = GetRelError((double)SUB84(dVar10,0),(double)local_f4);
          if ((local_15 & 1) != 0) {
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,SUB84(dVar9,0));
            poVar5 = std::operator<<(poVar5,"\t");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,SUB84(dVar10,0));
            poVar5 = std::operator<<(poVar5,"\t");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_f4);
            poVar5 = std::operator<<(poVar5,"\t");
            pvVar6 = (void *)std::ostream::operator<<(poVar5,local_e8);
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          local_2cc = (float)local_e0;
          auVar15._8_4_ = uVar20;
          auVar15._0_8_ = local_40;
          auVar15._12_4_ = 0x45300000;
          dVar9 = exp((double)local_48 +
                      (double)((local_44 - local_48) * local_2cc) /
                      ((auVar15._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0)));
          dVar10 = log(dVar9);
          if ((local_18 & 1) == 0) {
            if (bVar2) {
              NFastOps::LogAvx2<false,false>(in_stack_00000308,in_stack_00000300,in_stack_000002f8);
            }
            else if (bVar3) {
              NFastOps::LogAvx<false,false>(in_stack_000002e8,in_stack_000002e0,in_stack_000002d8);
            }
            else {
              NFastOps::LogPlain(in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                                 (double *)in_stack_fffffffffffffb60);
            }
          }
          else if (bVar2) {
            NFastOps::LogAvx2<true,false>
                      (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                      );
          }
          else if (bVar3) {
            NFastOps::LogAvx<true,false>
                      (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                      );
          }
          else {
            NFastOps::LogPlain(in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                               (double *)in_stack_fffffffffffffb60);
          }
          local_e8 = GetRelError(dVar10,local_110);
          if ((local_15 & 1) != 0) {
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,dVar9);
            poVar5 = std::operator<<(poVar5,"\t");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar10);
            poVar5 = std::operator<<(poVar5,"\t");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_110);
            poVar5 = std::operator<<(poVar5,"\t");
            pvVar6 = (void *)std::ostream::operator<<(poVar5,local_e8);
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        if (local_a0 < local_e8) {
          local_a0 = local_e8;
        }
      }
    }
    else {
      bVar4 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
      if (bVar4) {
        for (local_118 = 0; local_118 < local_40 + 1U; local_118 = local_118 + 1) {
          if ((local_16 & 1) == 0) {
            auVar16._8_4_ = uVar20;
            auVar16._0_8_ = local_40;
            auVar16._12_4_ = 0x45300000;
            fVar7 = (float)((double)local_48 +
                           (double)((local_44 - local_48) * (float)local_118) /
                           ((auVar16._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0)));
            dVar9 = std::exp((double)((ulong)(uint)fVar7 ^ 0x8000000080000000));
            fVar8 = 1.0 / (SUB84(dVar9,0) + 1.0);
            if ((local_18 & 1) == 0) {
              if (bVar2) {
                NFastOps::SigmoidAvx2<false,false>
                          ((float *)in_stack_fffffffffffffbc8,
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           (float *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              }
              else if (bVar3) {
                NFastOps::SigmoidAvx<false,false>
                          ((float *)in_stack_fffffffffffffbc8,
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           (float *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              }
              else {
                NFastOps::SigmoidPlain
                          ((float *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                           (float *)in_stack_fffffffffffffb60);
              }
            }
            else if (bVar2) {
              NFastOps::SigmoidAvx2<true,false>
                        ((float *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                         (float *)in_stack_fffffffffffffb58);
            }
            else if (bVar3) {
              NFastOps::SigmoidAvx<true,false>
                        ((float *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                         (float *)in_stack_fffffffffffffb58);
            }
            else {
              NFastOps::SigmoidPlain
                        ((float *)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                         (float *)in_stack_fffffffffffffb60);
            }
            local_120 = GetRelError((double)fVar8,(double)local_12c);
            if ((local_15 & 1) != 0) {
              poVar5 = (ostream *)std::ostream::operator<<(&std::cout,fVar7);
              poVar5 = std::operator<<(poVar5,"\t");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar8);
              poVar5 = std::operator<<(poVar5,"\t");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_12c);
              poVar5 = std::operator<<(poVar5,"\t");
              pvVar6 = (void *)std::ostream::operator<<(poVar5,local_120);
              std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            local_384 = (float)local_118;
            auVar17._8_4_ = uVar20;
            auVar17._0_8_ = local_40;
            auVar17._12_4_ = 0x45300000;
            dVar9 = (double)local_48 +
                    (double)((local_44 - local_48) * local_384) /
                    ((auVar17._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0));
            dVar10 = exp(-dVar9);
            dVar10 = 1.0 / (dVar10 + 1.0);
            if ((local_18 & 1) == 0) {
              if (bVar2) {
                NFastOps::SigmoidAvx2<false,false>
                          (in_stack_fffffffffffffbc8,
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           (double *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              }
              else if (bVar3) {
                NFastOps::SigmoidAvx<false,false>
                          (in_stack_fffffffffffffbc8,
                           CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                           (double *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              }
              else {
                NFastOps::SigmoidPlain
                          (in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                           (double *)in_stack_fffffffffffffb60);
              }
            }
            else if (bVar2) {
              NFastOps::SigmoidAvx2<true,false>
                        (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                         in_stack_fffffffffffffb58);
            }
            else if (bVar3) {
              NFastOps::SigmoidAvx<true,false>
                        (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                         in_stack_fffffffffffffb58);
            }
            else {
              NFastOps::SigmoidPlain
                        (in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                         (double *)in_stack_fffffffffffffb60);
            }
            local_120 = GetRelError(dVar10,local_148);
            if ((local_15 & 1) != 0) {
              poVar5 = (ostream *)std::ostream::operator<<(&std::cout,dVar9);
              poVar5 = std::operator<<(poVar5,"\t");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar10);
              poVar5 = std::operator<<(poVar5,"\t");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_148);
              poVar5 = std::operator<<(poVar5,"\t");
              pvVar6 = (void *)std::ostream::operator<<(poVar5,local_120);
              std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
            }
          }
          if (local_a0 < local_120) {
            local_a0 = local_120;
          }
        }
      }
      else {
        bVar4 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
        if (bVar4) {
          for (local_150 = 0; local_150 < local_40 + 1U; local_150 = local_150 + 1) {
            if ((local_16 & 1) == 0) {
              local_3e0 = (float)local_150;
              auVar18._8_4_ = uVar20;
              auVar18._0_8_ = local_40;
              auVar18._12_4_ = 0x45300000;
              fVar8 = (float)((double)local_48 +
                             (double)((local_44 - local_48) * local_3e0) /
                             ((auVar18._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0)));
              dVar9 = std::tanh((double)(ulong)(uint)fVar8);
              if ((local_18 & 1) == 0) {
                if (bVar2) {
                  NFastOps::TanhAvx2<false,false>
                            ((float *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                             (float *)in_stack_fffffffffffffb58);
                }
                else if (bVar3) {
                  NFastOps::TanhAvx<false,false>
                            ((float *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                             (float *)in_stack_fffffffffffffb58);
                }
                else {
                  NFastOps::TanhPlain((float *)in_stack_fffffffffffffb70,
                                      (size_t)in_stack_fffffffffffffb68,
                                      (float *)in_stack_fffffffffffffb60);
                }
              }
              else if (bVar2) {
                NFastOps::TanhAvx2<true,false>
                          ((float *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                           (float *)in_stack_fffffffffffffb58);
              }
              else if (bVar3) {
                NFastOps::TanhAvx<true,false>
                          ((float *)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                           (float *)in_stack_fffffffffffffb58);
              }
              else {
                NFastOps::TanhPlain((float *)in_stack_fffffffffffffb70,
                                    (size_t)in_stack_fffffffffffffb68,
                                    (float *)in_stack_fffffffffffffb60);
              }
              local_158 = GetRelError((double)SUB84(dVar9,0),(double)local_164);
              if ((local_15 & 1) != 0) {
                poVar5 = (ostream *)std::ostream::operator<<(&std::cout,fVar8);
                poVar5 = std::operator<<(poVar5,"\t");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,SUB84(dVar9,0));
                poVar5 = std::operator<<(poVar5,"\t");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_164);
                poVar5 = std::operator<<(poVar5,"\t");
                pvVar6 = (void *)std::ostream::operator<<(poVar5,local_158);
                std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
              }
            }
            else {
              auVar19._8_4_ = uVar20;
              auVar19._0_8_ = local_40;
              auVar19._12_4_ = 0x45300000;
              dVar9 = (double)local_48 +
                      (double)((local_44 - local_48) * (float)local_150) /
                      ((auVar19._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0));
              dVar10 = tanh(dVar9);
              if ((local_18 & 1) == 0) {
                if (bVar2) {
                  NFastOps::TanhAvx2<false,false>
                            (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                             in_stack_fffffffffffffb58);
                }
                else if (bVar3) {
                  NFastOps::TanhAvx<false,false>
                            (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                             in_stack_fffffffffffffb58);
                }
                else {
                  NFastOps::TanhPlain(in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                                      (double *)in_stack_fffffffffffffb60);
                }
              }
              else if (bVar2) {
                NFastOps::TanhAvx2<true,false>
                          (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                           in_stack_fffffffffffffb58);
              }
              else if (bVar3) {
                NFastOps::TanhAvx<true,false>
                          (in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                           in_stack_fffffffffffffb58);
              }
              else {
                NFastOps::TanhPlain(in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                                    (double *)in_stack_fffffffffffffb60);
              }
              local_158 = GetRelError(dVar10,in_stack_fffffffffffffe80);
              if ((local_15 & 1) != 0) {
                poVar5 = (ostream *)std::ostream::operator<<(&std::cout,dVar9);
                poVar5 = std::operator<<(poVar5,"\t");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar10);
                poVar5 = std::operator<<(poVar5,"\t");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_fffffffffffffe80);
                poVar5 = std::operator<<(poVar5,"\t");
                in_stack_fffffffffffffb70 = (double *)std::ostream::operator<<(poVar5,local_158);
                std::ostream::operator<<
                          (in_stack_fffffffffffffb70,std::endl<char,std::char_traits<char>>);
              }
            }
            if (local_a0 < local_158) {
              local_a0 = local_158;
            }
          }
        }
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Maximum relative error: ");
  this = (TEvalOpts *)std::ostream::operator<<(poVar5,local_a0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  TEvalOpts::~TEvalOpts(this);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TEvalOpts opts = ParseOptions(argc, argv);

    if (opts.NoDenormals) {
        _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
        _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);
    }

    if (!(opts.Arch == "plain" || opts.Arch == "avx2" || opts.Arch == "avx")) {
        std::cerr << "requirement arch == \"plain\" || arch == \"avx2\" || arch == \"avx\" failed" << std::endl;
        exit(1);
    }
    if (!(opts.Func == "exp" || opts.Func == "log" || opts.Func == "sigm" || opts.Func == "tanh")) {
        std::cerr << "requirement func == \"exp\" || func == \"log\" || func == \"sigm\" || func == \"tanh\" failed" << std::endl;
        exit(1);
    }

    bool isAvx2 = opts.Arch == "avx2";
    bool isAvx = opts.Arch == "avx";
    float lo = opts.Lo;
    float hi = opts.Hi;
    size_t n = opts.N;

    if (opts.Print) {
        std::cout << "input\ttrue\tapprox" << std::endl;
    }

    double maxError = 0;
    if (opts.Func == "exp") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = exp(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = exp(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::ExpAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::ExpAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::ExpPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "log") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                input = exp(input);
                float trueVal = log(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::LogAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::LogAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                input = exp(input);
                double trueVal = log(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::LogAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::LogAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::LogAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::LogPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "sigm") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = 1.0 / (1.0 + exp(-input));
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = 1.0 / (1.0 + exp(-input));
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::SigmoidAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::SigmoidAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::SigmoidPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    } else if (opts.Func == "tanh") {
        for (size_t i = 0; i < n + 1; ++i) {
            double error = 0;
            if (!opts.UseDouble) {
                float input = lo + (hi - lo) * i * 1.0 / n;
                float trueVal = tanh(input);
                float approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            } else {
                double input = lo + (hi - lo) * i * 1.0 / n;
                double trueVal = tanh(input);
                double approxVal;
                if (opts.Exact) {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<true, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<true, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                } else {
                    if (isAvx2) {
                        NFastOps::TanhAvx2<false, false>(&input, 1, &approxVal);
                    } else if (isAvx) {
                        NFastOps::TanhAvx<false, false>(&input, 1, &approxVal);
                    } else {
                        NFastOps::TanhPlain(&input, 1, &approxVal);
                    }
                }
                error = GetRelError(trueVal, approxVal);
                if (opts.Print) {
                    std::cout << input << "\t" << trueVal << "\t" << approxVal << "\t" << error << std::endl;
                }
            }
            if (error > maxError) {
                maxError = error;
            }
        }
    }
    std::cout << "Maximum relative error: " << maxError << std::endl;
}